

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O2

type __thiscall
nonstd::optional_lite::optional<tinyusdz::Token>::operator=
          (optional<tinyusdz::Token> *this,optional<tinyusdz::Token> *other)

{
  string *psVar1;
  value_type *value;
  
  if (this->has_value_ == true) {
    if (other->has_value_ == false) {
      reset(this);
    }
    else {
      psVar1 = (string *)operator*(other);
      std::__cxx11::string::operator=((string *)&this->contained,psVar1);
    }
  }
  else if (other->has_value_ != false) {
    value = operator*(other);
    initialize<tinyusdz::Token>(this,value);
  }
  return this;
}

Assistant:

operator=( optional && other ) noexcept
    {
        if      ( (has_value() == true ) && (other.has_value() == false) ) { reset(); }
        else if ( (has_value() == false) && (other.has_value() == true ) ) { initialize( std::move( *other ) ); }
        else if ( (has_value() == true ) && (other.has_value() == true ) ) { contained.value() = std::move( *other ); }
        return *this;
    }